

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotScatterEx<ImPlot::GetterYs<double>>(char *label_id,GetterYs<double> *getter)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  undefined8 uVar4;
  bool bVar5;
  TransformerLogLog transformer;
  int iVar6;
  double *pdVar7;
  ImPlotPlot *pIVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col_mk_line;
  ImU32 col_mk_fill;
  ImDrawList *DrawList;
  int iVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  double dVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  double *pdVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  ImPlotPoint p;
  ImPlotPoint local_90;
  uint local_7c;
  undefined1 local_78 [16];
  double local_68;
  undefined8 uStack_60;
  double *local_58;
  double dStack_50;
  double *local_48;
  undefined8 uStack_40;
  
  bVar11 = BeginItem(label_id,2);
  if (bVar11) {
    if ((GImPlot->FitThisFrame == true) && (iVar12 = getter->Count, 0 < iVar12)) {
      iVar14 = 0;
      do {
        local_90.x = (double)iVar14 * getter->XScale + getter->X0;
        local_90.y = *(double *)
                      ((long)getter->Ys +
                      (long)(((getter->Offset + iVar14) % iVar12 + iVar12) % iVar12) *
                      (long)getter->Stride);
        FitPoint(&local_90);
        iVar14 = iVar14 + 1;
        iVar12 = getter->Count;
      } while (iVar14 < iVar12);
    }
    pIVar13 = GImPlot;
    DrawList = GetPlotDrawList();
    iVar12 = (pIVar13->NextItemData).Marker;
    iVar14 = 0;
    if (iVar12 != -1) {
      iVar14 = iVar12;
    }
    col_mk_line = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 3);
    pIVar10 = GImPlot;
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar12 = getter->Count;
      if (0 < iVar12) {
        pdVar7 = getter->Ys;
        pdVar20 = (double *)getter->XScale;
        local_58 = (double *)getter->X0;
        uVar21 = SUB84(local_58,0);
        uVar22 = (undefined4)((ulong)local_58 >> 0x20);
        dVar15 = (double)(ulong)(uint)getter->Offset;
        fVar1 = (pIVar13->NextItemData).MarkerSize;
        fVar2 = (pIVar13->NextItemData).MarkerWeight;
        iVar6 = getter->Stride;
        iVar16 = 0;
        dVar23 = 0.0;
        bVar11 = (pIVar13->NextItemData).RenderMarkerLine;
        bVar5 = (pIVar13->NextItemData).RenderMarkerFill;
        pIVar13 = GImPlot;
        local_68 = dVar15;
        local_48 = pdVar20;
        do {
          IVar3 = pIVar13->PixelRange[transformer.YAxis].Min;
          fVar18 = (float)(pIVar13->Mx *
                           (((double)pdVar20 * dVar23 + (double)CONCAT44(uVar22,uVar21)) -
                           (pIVar13->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x);
          fVar19 = (float)(pIVar13->My[transformer.YAxis] *
                           (*(double *)
                             ((long)pdVar7 +
                             (long)(((SUB84(dVar15,0) + iVar16) % iVar12 + iVar12) % iVar12) *
                             (long)iVar6) - pIVar13->CurrentPlot->YAxis[transformer.YAxis].Range.Min
                           ) + (double)IVar3.y);
          local_90.x = (double)CONCAT44(fVar19,fVar18);
          pIVar8 = pIVar10->CurrentPlot;
          if ((((pIVar8->PlotRect).Min.x <= fVar18) && ((pIVar8->PlotRect).Min.y <= fVar19)) &&
             ((fVar18 < (pIVar8->PlotRect).Max.x && (fVar19 < (pIVar8->PlotRect).Max.y)))) {
            local_78._0_8_ = dVar23;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<double>>(ImPlot::GetterYs<double>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar14 * 8))
                      (fVar1,fVar2,DrawList,&local_90,bVar11,col_mk_line,bVar5,col_mk_fill);
            uVar21 = SUB84(local_58,0);
            uVar22 = (undefined4)((ulong)local_58 >> 0x20);
            pIVar13 = GImPlot;
            dVar15 = local_68;
            pdVar20 = local_48;
            dVar23 = (double)local_78._0_8_;
          }
          dVar23 = dVar23 + 1.0;
          iVar16 = iVar16 + 1;
        } while (iVar12 != iVar16);
      }
      break;
    case 1:
      iVar12 = getter->Count;
      if (0 < iVar12) {
        local_58 = getter->Ys;
        local_68 = getter->XScale;
        dVar15 = getter->X0;
        iVar6 = getter->Offset;
        fVar1 = (pIVar13->NextItemData).MarkerSize;
        fVar2 = (pIVar13->NextItemData).MarkerWeight;
        iVar16 = getter->Stride;
        iVar17 = 0;
        dVar23 = 0.0;
        bVar11 = (pIVar13->NextItemData).RenderMarkerLine;
        local_7c = (uint)(pIVar13->NextItemData).RenderMarkerFill;
        do {
          pIVar13 = GImPlot;
          local_78._0_8_ = dVar23;
          local_48 = *(double **)
                      ((long)local_58 +
                      (long)(((iVar6 + iVar17) % iVar12 + iVar12) % iVar12) * (long)iVar16);
          uStack_40 = 0;
          dVar23 = log10((local_68 * dVar23 + dVar15) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar8 = pIVar13->CurrentPlot;
          dVar9 = (pIVar8->XAxis).Range.Min;
          IVar3 = pIVar13->PixelRange[transformer.YAxis].Min;
          fVar18 = (float)(pIVar13->Mx *
                           (((double)(float)(dVar23 / pIVar13->LogDenX) *
                             ((pIVar8->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar3.x
                          );
          fVar19 = (float)(pIVar13->My[transformer.YAxis] *
                           ((double)local_48 - pIVar8->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar3.y);
          local_90.x = (double)CONCAT44(fVar19,fVar18);
          pIVar8 = pIVar10->CurrentPlot;
          if ((((pIVar8->PlotRect).Min.x <= fVar18) && ((pIVar8->PlotRect).Min.y <= fVar19)) &&
             ((fVar18 < (pIVar8->PlotRect).Max.x && (fVar19 < (pIVar8->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<double>>(ImPlot::GetterYs<double>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar14 * 8))
                      (fVar1,fVar2,DrawList,&local_90,bVar11,col_mk_line,local_7c,col_mk_fill);
          }
          dVar23 = (double)local_78._0_8_ + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar12 != iVar17);
      }
      break;
    case 2:
      iVar12 = getter->Count;
      if (0 < iVar12) {
        local_48 = getter->Ys;
        local_58 = (double *)getter->XScale;
        dStack_50 = getter->X0;
        local_68 = getter->X0;
        uStack_60._0_4_ = getter->Offset;
        uStack_60._4_4_ = getter->Stride;
        iVar6 = getter->Offset;
        fVar1 = (pIVar13->NextItemData).MarkerSize;
        fVar2 = (pIVar13->NextItemData).MarkerWeight;
        iVar16 = getter->Stride;
        iVar17 = 0;
        dVar15 = 0.0;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        bVar11 = (pIVar13->NextItemData).RenderMarkerLine;
        bVar5 = (pIVar13->NextItemData).RenderMarkerFill;
        do {
          pIVar13 = GImPlot;
          local_78._0_8_ = dVar15;
          dVar23 = log10(*(double *)
                          ((long)local_48 +
                          (long)(((iVar6 + iVar17) % iVar12 + iVar12) % iVar12) * (long)iVar16) /
                         GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar8 = pIVar13->CurrentPlot;
          dVar15 = pIVar8->YAxis[transformer.YAxis].Range.Min;
          IVar3 = pIVar13->PixelRange[transformer.YAxis].Min;
          fVar18 = (float)(pIVar13->Mx *
                           ((local_68 + local_78._0_8_ * (double)local_58) -
                           (pIVar8->XAxis).Range.Min) + (double)IVar3.x);
          fVar19 = (float)(pIVar13->My[transformer.YAxis] *
                           ((dVar15 + (double)(float)(dVar23 / pIVar13->LogDenY[transformer.YAxis])
                                      * (pIVar8->YAxis[transformer.YAxis].Range.Max - dVar15)) -
                           dVar15) + (double)IVar3.y);
          local_90.x = (double)CONCAT44(fVar19,fVar18);
          pIVar8 = pIVar10->CurrentPlot;
          if (((((pIVar8->PlotRect).Min.x <= fVar18) &&
               (uVar4 = *(undefined8 *)&(pIVar8->PlotRect).Min.y, (float)uVar4 <= fVar19)) &&
              (fVar18 < (float)((ulong)uVar4 >> 0x20))) && (fVar19 < (pIVar8->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<double>>(ImPlot::GetterYs<double>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar14 * 8))
                      (fVar1,fVar2,DrawList,&local_90,bVar11,col_mk_line,bVar5,col_mk_fill);
          }
          dVar15 = (double)CONCAT44(local_78._4_4_,local_78._0_4_) + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar12 != iVar17);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<double>>
                (*getter,transformer,DrawList,iVar14,(pIVar13->NextItemData).MarkerSize,
                 (pIVar13->NextItemData).RenderMarkerLine,col_mk_line,
                 (pIVar13->NextItemData).MarkerWeight,(pIVar13->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}